

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

void flatbuffers::php::PhpGenerator::BuildFieldOfTable
               (FieldDef *field,size_t offset,string *code_ptr)

{
  Type *type;
  FieldDef *field_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code;
  string *code_ptr_local;
  size_t offset_local;
  FieldDef *field_local;
  
  local_28 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)offset;
  offset_local = (size_t)field;
  std::operator+(&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"/**\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::operator+(&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @param FlatBufferBuilder $builder\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::operator+(&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @param ");
  GenTypeBasic_abi_cxx11_(&local_f8,(PhpGenerator *)(offset_local + 200),type);
  std::operator+(&local_b8,&local_d8,&local_f8);
  std::operator+(&local_98,&local_b8,"\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::operator+(&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @return void\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::operator+(&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," */\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::operator+(&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"public static function ");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  ConvertCase(&local_198,(string *)offset_local,kUpperCamel,kSnake);
  std::operator+(&local_178,"add",&local_198);
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::operator+=((string *)local_28,"(FlatBufferBuilder $builder, ");
  ConvertCase(&local_1d8,(string *)offset_local,kLowerCamel,kSnake);
  std::operator+(&local_1b8,"$",&local_1d8);
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::operator+=((string *)local_28,")\n");
  std::operator+(&local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"{\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::operator+(&local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_218,&local_238,"$builder->add");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  GenMethod_abi_cxx11_(&local_278,(PhpGenerator *)offset_local,field_00);
  std::operator+(&local_258,&local_278,"X(");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  NumToString<unsigned_long>(&local_2b8,(unsigned_long)code_ptr_local);
  std::operator+(&local_298,&local_2b8,", ");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  ConvertCase(&local_2f8,(string *)offset_local,kLowerCamel,kSnake);
  std::operator+(&local_2d8,"$",&local_2f8);
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::operator+=((string *)local_28,", ");
  if (*(int *)(offset_local + 200) == 2) {
    std::__cxx11::string::operator+=((string *)local_28,"false");
  }
  else {
    std::__cxx11::string::operator+=((string *)local_28,(string *)(offset_local + 0xe8));
  }
  std::__cxx11::string::operator+=((string *)local_28,");\n");
  std::operator+(&local_318,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"}\n\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  return;
}

Assistant:

static void BuildFieldOfTable(const FieldDef &field, const size_t offset,
                                std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += Indent + "/**\n";
    code += Indent + " * @param FlatBufferBuilder $builder\n";
    code += Indent + " * @param " + GenTypeBasic(field.value.type) + "\n";
    code += Indent + " * @return void\n";
    code += Indent + " */\n";
    code += Indent + "public static function ";
    code += "add" + ConvertCase(field.name, Case::kUpperCamel);
    code += "(FlatBufferBuilder $builder, ";
    code += "$" + ConvertCase(field.name, Case::kLowerCamel);
    code += ")\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$builder->add";
    code += GenMethod(field) + "X(";
    code += NumToString(offset) + ", ";

    code += "$" + ConvertCase(field.name, Case::kLowerCamel);
    code += ", ";

    if (field.value.type.base_type == BASE_TYPE_BOOL) {
      code += "false";
    } else {
      code += field.value.constant;
    }
    code += ");\n";
    code += Indent + "}\n\n";
  }